

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void freetypeinfo(MOJOSHADER_symbolTypeInfo *typeinfo,MOJOSHADER_free f,void *d)

{
  ulong uVar1;
  long lVar2;
  
  if (typeinfo->member_count != 0) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      (*f)(*(void **)((long)typeinfo->members + lVar2 + -8),d);
      freetypeinfo((MOJOSHADER_symbolTypeInfo *)((long)&typeinfo->members->name + lVar2),f,d);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x28;
    } while (uVar1 < typeinfo->member_count);
  }
  (*f)(typeinfo->members,d);
  return;
}

Assistant:

void freetypeinfo(MOJOSHADER_symbolTypeInfo *typeinfo,
                  MOJOSHADER_free f, void *d)
{
    int i;
    for (i = 0; i < typeinfo->member_count; i++)
    {
        f((void *) typeinfo->members[i].name, d);
        freetypeinfo(&typeinfo->members[i].info, f, d);
    } // for
    f((void *) typeinfo->members, d);
}